

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Locale.cpp
# Opt level: O3

json loadLocaleData(string *fn)

{
  bool bVar1;
  undefined8 extraout_RAX;
  undefined8 extraout_RAX_00;
  undefined8 uVar2;
  json_value extraout_RDX;
  json_value extraout_RDX_00;
  json_value jVar3;
  string *in_RSI;
  json jVar4;
  char *bytes;
  int count;
  char *local_48;
  int local_3c;
  _Any_data local_38;
  code *local_28;
  undefined8 uStack_20;
  
  local_48 = (char *)0x0;
  local_3c = 0;
  bVar1 = f8n::env::FileToByteArray(in_RSI,&local_48,&local_3c,true);
  if (bVar1) {
    local_28 = (code *)0x0;
    uStack_20 = 0;
    local_38._M_unused._M_object = (void *)0x0;
    local_38._8_8_ = 0;
    nlohmann::json_abi_v3_11_2::
    basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_2::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
    ::parse<char*&>((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_2::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
                     *)fn,&local_48,(parser_callback_t *)&local_38,true,false);
    if (local_28 != (code *)0x0) {
      (*local_28)(&local_38,&local_38,__destroy_functor);
    }
    free(local_48);
    uVar2 = extraout_RAX;
    jVar3 = extraout_RDX;
  }
  else {
    *(undefined1 *)&(fn->_M_dataplus)._M_p = 0;
    fn->_M_string_length = 0;
    nlohmann::json_abi_v3_11_2::
    basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
    ::assert_invariant((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                        *)fn,true);
    nlohmann::json_abi_v3_11_2::
    basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
    ::assert_invariant((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                        *)fn,true);
    uVar2 = extraout_RAX_00;
    jVar3 = extraout_RDX_00;
  }
  jVar4.m_value.object = jVar3.object;
  jVar4._0_8_ = uVar2;
  return jVar4;
}

Assistant:

static nlohmann::json loadLocaleData(const std::string& fn) {
    char* bytes = nullptr;
    int count = 0;

    if (FileToByteArray(fn, &bytes, count, true) == true) {
        try {
            nlohmann::json localeData = nlohmann::json::parse(bytes);
            free(bytes);
            return localeData;
        }
        catch (...) {
        }

        free(bytes);
    }

    return nlohmann::json();
}